

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debughud.cpp
# Opt level: O0

void __thiscall CDebugHud::RenderTuning(CDebugHud *this)

{
  int iVar1;
  CConfig *pCVar2;
  IGraphics *pIVar3;
  ITextRender *pIVar4;
  char *pcVar5;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float RampedSpeed;
  float Ramp;
  float Speed;
  int i_1;
  float pv;
  float Height;
  float y;
  int i;
  float Standard;
  float Current;
  CTuningParams StandardTuning;
  CLineItem Array [100];
  char aBuf [128];
  float in_stack_fffffffffffff818;
  float in_stack_fffffffffffff81c;
  float in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  undefined4 in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff82c;
  undefined8 in_stack_fffffffffffff830;
  CLineItem *this_00;
  CTuningParams *in_stack_fffffffffffff838;
  CLineItem *pCVar8;
  CTextCursor *in_stack_fffffffffffff840;
  int local_788;
  float local_784;
  int local_778;
  CLineItem local_760;
  float local_750;
  float local_74c;
  CLineItem local_6c8 [100];
  CLineItem local_88 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = CComponent::Config((CComponent *)0x15ee46);
  if (pCVar2->m_DbgTuning != 0) {
    CTuningParams::CTuningParams
              ((CTuningParams *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    pIVar3 = CComponent::Graphics((CComponent *)0x15ee6b);
    CComponent::Graphics((CComponent *)0x15ee7a);
    IGraphics::ScreenAspect
              ((IGraphics *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    (*(pIVar3->super_IInterface)._vptr_IInterface[5])(0);
    if ((RenderTuning()::s_CursorStandard == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderTuning()::s_CursorStandard), iVar1 != 0)) {
      CTextCursor::CTextCursor
                (in_stack_fffffffffffff840,(float)((ulong)in_stack_fffffffffffff838 >> 0x20),
                 SUB84(in_stack_fffffffffffff838,0),
                 (float)((ulong)in_stack_fffffffffffff830 >> 0x20),(int)in_stack_fffffffffffff830);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderTuning::s_CursorStandard,&__dso_handle);
      __cxa_guard_release(&RenderTuning()::s_CursorStandard);
    }
    if ((RenderTuning()::s_CursorCurrent == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderTuning()::s_CursorCurrent), iVar1 != 0)) {
      CTextCursor::CTextCursor
                (in_stack_fffffffffffff840,(float)((ulong)in_stack_fffffffffffff838 >> 0x20),
                 SUB84(in_stack_fffffffffffff838,0),
                 (float)((ulong)in_stack_fffffffffffff830 >> 0x20),(int)in_stack_fffffffffffff830);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderTuning::s_CursorCurrent,&__dso_handle);
      __cxa_guard_release(&RenderTuning()::s_CursorCurrent);
    }
    if ((RenderTuning()::s_CursorLabels == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderTuning()::s_CursorLabels), iVar1 != 0)) {
      CTextCursor::CTextCursor
                (in_stack_fffffffffffff840,(float)((ulong)in_stack_fffffffffffff838 >> 0x20),
                 SUB84(in_stack_fffffffffffff838,0),
                 (float)((ulong)in_stack_fffffffffffff830 >> 0x20),(int)in_stack_fffffffffffff830);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderTuning::s_CursorLabels,&__dso_handle);
      __cxa_guard_release(&RenderTuning()::s_CursorLabels);
    }
    RenderTuning::s_CursorStandard.m_MaxLines = -1;
    RenderTuning::s_CursorStandard.m_LineSpacing = 1.0;
    RenderTuning::s_CursorStandard.m_Align = 2;
    CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                       CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
    RenderTuning::s_CursorCurrent.m_MaxLines = -1;
    RenderTuning::s_CursorCurrent.m_LineSpacing = 1.0;
    RenderTuning::s_CursorCurrent.m_Align = 2;
    CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                       CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
    RenderTuning::s_CursorLabels.m_MaxLines = -1;
    RenderTuning::s_CursorLabels.m_LineSpacing = 1.0;
    CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                       CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
    for (local_778 = 0; iVar1 = CTuningParams::Num(), local_778 < iVar1; local_778 = local_778 + 1)
    {
      CTuningParams::Get(in_stack_fffffffffffff838,(int)((ulong)in_stack_fffffffffffff830 >> 0x20),
                         (float *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      CTuningParams::Get(in_stack_fffffffffffff838,(int)((ulong)in_stack_fffffffffffff830 >> 0x20),
                         (float *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      if ((local_750 != local_74c) || (NAN(local_750) || NAN(local_74c))) {
        pIVar4 = CComponent::TextRender((CComponent *)0x15f185);
        (*(pIVar4->super_IInterface)._vptr_IInterface[4])(0x3f800000);
      }
      else {
        pIVar4 = CComponent::TextRender((CComponent *)0x15f0f3);
        (*(pIVar4->super_IInterface)._vptr_IInterface[4])(0x3f800000);
      }
      str_format((char *)(double)local_750,(int)local_88,(char *)0x80,"%.2f");
      pIVar4 = CComponent::TextRender((CComponent *)0x15f1d6);
      (*(pIVar4->super_IInterface)._vptr_IInterface[7])
                (pIVar4,&RenderTuning::s_CursorStandard,local_88,0xffffffff);
      str_format((char *)(double)local_74c,(int)local_88,(char *)0x80,"%.2f");
      pIVar4 = CComponent::TextRender((CComponent *)0x15f225);
      (*(pIVar4->super_IInterface)._vptr_IInterface[7])
                (pIVar4,&RenderTuning::s_CursorCurrent,local_88,0xffffffff);
      pIVar4 = CComponent::TextRender((CComponent *)0x15f24c);
      pcVar5 = CTuningParams::GetName((CTuningParams *)(*(long *)(in_RDI + 8) + 0xd28),local_778);
      (*(pIVar4->super_IInterface)._vptr_IInterface[7])
                (pIVar4,&RenderTuning::s_CursorLabels,pcVar5,0xffffffff);
      pIVar4 = CComponent::TextRender((CComponent *)0x15f291);
      (*(pIVar4->super_IInterface)._vptr_IInterface[8])(pIVar4,&RenderTuning::s_CursorStandard);
      pIVar4 = CComponent::TextRender((CComponent *)0x15f2ab);
      (*(pIVar4->super_IInterface)._vptr_IInterface[8])(pIVar4,&RenderTuning::s_CursorCurrent);
      pIVar4 = CComponent::TextRender((CComponent *)0x15f2c5);
      (*(pIVar4->super_IInterface)._vptr_IInterface[8])(pIVar4,&RenderTuning::s_CursorLabels);
    }
    pIVar4 = CComponent::TextRender((CComponent *)0x15f2ef);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar4,&RenderTuning::s_CursorStandard,0,0xffffffff);
    pIVar4 = CComponent::TextRender((CComponent *)0x15f31b);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar4,&RenderTuning::s_CursorCurrent,0,0xffffffff);
    pIVar4 = CComponent::TextRender((CComponent *)0x15f347);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar4,&RenderTuning::s_CursorLabels,0,0xffffffff);
    iVar1 = CTuningParams::Num();
    fVar6 = (float)(iVar1 * 6) + 50.0;
    CComponent::Graphics((CComponent *)0x15f391);
    IGraphics::TextureClear
              ((IGraphics *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    pIVar3 = CComponent::Graphics((CComponent *)0x15f3a3);
    (*(pIVar3->super_IInterface)._vptr_IInterface[8])();
    pIVar3 = CComponent::Graphics((CComponent *)0x15f3b6);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x14])();
    local_784 = 1.0;
    this_00 = local_6c8;
    pCVar8 = local_88;
    do {
      IGraphics::CLineItem::CLineItem(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pCVar8);
    for (local_788 = 0; local_788 < 100; local_788 = local_788 + 1) {
      CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd5c));
      CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd60));
      CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd64));
      fVar7 = VelocityRamp(in_stack_fffffffffffff820,in_stack_fffffffffffff81c,
                           in_stack_fffffffffffff818,0.0);
      fVar7 = (((float)local_788 / 100.0) * 3000.0 * fVar7) / 1000.0;
      IGraphics::CLineItem::CLineItem
                (&local_760,(float)((local_788 + -1) * 2),-local_784 * 50.0 + fVar6 + 50.0,
                 (float)(local_788 << 1),-fVar7 * 50.0 + fVar6 + 50.0);
      local_6c8[local_788].m_X0 = local_760.m_X0;
      local_6c8[local_788].m_Y0 = local_760.m_Y0;
      local_6c8[local_788].m_X1 = local_760.m_X1;
      local_6c8[local_788].m_Y1 = local_760.m_Y1;
      local_784 = fVar7;
    }
    pIVar3 = CComponent::Graphics((CComponent *)0x15f5c8);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x16])(pIVar3,local_6c8,100);
    pIVar3 = CComponent::Graphics((CComponent *)0x15f5eb);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x15])();
    pIVar4 = CComponent::TextRender((CComponent *)0x15f601);
    (*(pIVar4->super_IInterface)._vptr_IInterface[4])(0x3f800000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CDebugHud::RenderTuning()
{
	// render tuning debugging
	if(!Config()->m_DbgTuning)
		return;

	CTuningParams StandardTuning;

	Graphics()->MapScreen(0, 0, 300*Graphics()->ScreenAspect(), 300);

	static CTextCursor s_CursorStandard(5.0f, 25.0f, 50.0f);
	static CTextCursor s_CursorCurrent(5.0f, 50.0f, 50.0f);
	static CTextCursor s_CursorLabels(5.0f, 55.0f, 50.0f);
	s_CursorStandard.m_MaxLines = -1;
	s_CursorStandard.m_LineSpacing = 1.0f;
	s_CursorStandard.m_Align = TEXTALIGN_TR;
	s_CursorStandard.Reset(0);
	s_CursorCurrent.m_MaxLines = -1;
	s_CursorCurrent.m_LineSpacing = 1.0f;
	s_CursorCurrent.m_Align = TEXTALIGN_TR;
	s_CursorCurrent.Reset();
	s_CursorLabels.m_MaxLines = -1;
	s_CursorLabels.m_LineSpacing = 1.0f;
	s_CursorLabels.Reset(0);

	for(int i = 0; i < m_pClient->m_Tuning.Num(); i++)
	{
		char aBuf[128];
		float Current, Standard;
		m_pClient->m_Tuning.Get(i, &Current);
		StandardTuning.Get(i, &Standard);

		if(Standard == Current)
			TextRender()->TextColor(1,1,1,1.0f);
		else
			TextRender()->TextColor(1,0.25f,0.25f,1.0f);

		str_format(aBuf, sizeof(aBuf), "%.2f", Standard);
		TextRender()->TextDeferred(&s_CursorStandard, aBuf, -1);

		str_format(aBuf, sizeof(aBuf), "%.2f", Current);
		TextRender()->TextDeferred(&s_CursorCurrent, aBuf, -1);

		TextRender()->TextDeferred(&s_CursorLabels, m_pClient->m_Tuning.GetName(i), -1);

		TextRender()->TextNewline(&s_CursorStandard);
		TextRender()->TextNewline(&s_CursorCurrent);
		TextRender()->TextNewline(&s_CursorLabels);
	}

	TextRender()->DrawTextOutlined(&s_CursorStandard);
	TextRender()->DrawTextOutlined(&s_CursorCurrent);
	TextRender()->DrawTextOutlined(&s_CursorLabels);

	float y = 50.0f+m_pClient->m_Tuning.Num()*6;

	Graphics()->TextureClear();
	Graphics()->BlendNormal();
	Graphics()->LinesBegin();
	float Height = 50.0f;
	float pv = 1;
	IGraphics::CLineItem Array[100];
	for(int i = 0; i < 100; i++)
	{
		float Speed = i/100.0f * 3000;
		float Ramp = VelocityRamp(Speed, m_pClient->m_Tuning.m_VelrampStart, m_pClient->m_Tuning.m_VelrampRange, m_pClient->m_Tuning.m_VelrampCurvature);
		float RampedSpeed = (Speed * Ramp)/1000.0f;
		Array[i] = IGraphics::CLineItem((i-1)*2, y+Height-pv*Height, i*2, y+Height-RampedSpeed*Height);
		//Graphics()->LinesDraw((i-1)*2, 200, i*2, 200);
		pv = RampedSpeed;
	}
	Graphics()->LinesDraw(Array, 100);
	Graphics()->LinesEnd();
	TextRender()->TextColor(1,1,1,1);
}